

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

string * __thiscall
cmFileAPI::WriteJsonFile
          (string *__return_storage_ptr__,cmFileAPI *this,Value *value,string *prefix,
          _func_string_string_ptr *computeSuffix)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  pointer pSVar4;
  undefined1 local_320 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined4 local_27c;
  Status local_278;
  undefined1 local_270 [8];
  ofstream ftmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string *tmpFile;
  _func_string_string_ptr *local_30;
  _func_string_string_ptr *computeSuffix_local;
  string *prefix_local;
  Value *value_local;
  cmFileAPI *this_local;
  string *fileName;
  
  tmpFile._7_1_ = 0;
  local_30 = computeSuffix;
  computeSuffix_local = (_func_string_string_ptr *)prefix;
  prefix_local = (string *)value;
  value_local = (Value *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_60,&this->APIv1,"/tmp.json");
  local_40 = &local_60;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_270,pcVar3,_S_out);
  pSVar4 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator->
                     (&this->JsonWriter);
  (*pSVar4->_vptr_StreamWriter[2])(pSVar4,prefix_local,local_270);
  std::operator<<((ostream *)local_270,"\n");
  std::ofstream::close();
  bVar1 = std::ios::operator!((ios *)(local_270 + (long)*(_func_int **)((long)local_270 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::operator+(&local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   computeSuffix_local,"-");
    (*local_30)((string *)((long)&file.field_2 + 8),local_40);
    std::operator+(&local_2c0,&local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file.field_2 + 8));
    std::operator+(&local_2a0,&local_2c0,".json");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_2e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                   &this->APIv1,"/reply");
    cmsys::SystemTools::MakeDirectory((string *)local_320,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)local_320,"/");
    std::__cxx11::string::operator+=((string *)local_320,(string *)__return_storage_ptr__);
    bVar2 = cmsys::SystemTools::FileExists((string *)local_320,true);
    if ((bVar2) || (bVar2 = cmSystemTools::RenameFile(local_40,(string *)local_320), !bVar2)) {
      cmsys::SystemTools::RemoveFile(local_40);
    }
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->ReplyFiles,__return_storage_ptr__);
    tmpFile._7_1_ = 1;
    local_27c = 1;
    std::__cxx11::string::~string((string *)local_320);
  }
  else {
    local_278 = cmsys::SystemTools::RemoveFile(local_40);
    tmpFile._7_1_ = 1;
    local_27c = 1;
  }
  std::ofstream::~ofstream(local_270);
  std::__cxx11::string::~string((string *)&local_60);
  if ((tmpFile._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::WriteJsonFile(
  Json::Value const& value, std::string const& prefix,
  std::string (*computeSuffix)(std::string const&))
{
  std::string fileName;

  // Write the json file with a temporary name.
  std::string const& tmpFile = this->APIv1 + "/tmp.json";
  cmsys::ofstream ftmp(tmpFile.c_str());
  this->JsonWriter->write(value, &ftmp);
  ftmp << "\n";
  ftmp.close();
  if (!ftmp) {
    cmSystemTools::RemoveFile(tmpFile);
    return fileName;
  }

  // Compute the final name for the file.
  fileName = prefix + "-" + computeSuffix(tmpFile) + ".json";

  // Create the destination.
  std::string file = this->APIv1 + "/reply";
  cmSystemTools::MakeDirectory(file);
  file += "/";
  file += fileName;

  // If the final name already exists then assume it has proper content.
  // Otherwise, atomically place the reply file at its final name
  if (cmSystemTools::FileExists(file, true) ||
      !cmSystemTools::RenameFile(tmpFile, file)) {
    cmSystemTools::RemoveFile(tmpFile);
  }

  // Record this among files we have just written.
  this->ReplyFiles.insert(fileName);

  return fileName;
}